

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_af1b6::CpuAbsoluteTest_sre_sets_c_and_n_Test::
~CpuAbsoluteTest_sre_sets_c_and_n_Test(CpuAbsoluteTest_sre_sets_c_and_n_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest((CpuTest *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuAbsoluteTest, sre_sets_c_and_n) {
    registers.p = Z_FLAG;
    registers.a = 0b11110000;
    expected.a = 0b10110001;
    expected.p = C_FLAG | N_FLAG;
    memory_content = 0b10000011;

    run_readwrite_instruction(SRE_ABS, 0b01000001);
}